

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.h
# Opt level: O2

string * FastRegExp::Unicode::toString<char32_t>(string *__return_storage_ptr__,char32_t *v)

{
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  wStack_78;
  
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::wstring_convert(&wStack_78);
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&wStack_78,*v);
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&wStack_78);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string toString(const T &v)
{
    return std::wstring_convert<
        DeletableFacet<
            std::codecvt<
                char32_t,
                char,
                std::mbstate_t
            >
        >,
        char32_t
    >().to_bytes(v);
}